

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update55_ghosts(Integer g_a)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  C_Integer *pCVar6;
  int **ppiVar7;
  ushort uVar8;
  Integer proc;
  logical lVar9;
  Integer *map;
  Integer *proclist;
  long lVar10;
  size_t sVar11;
  Integer IVar12;
  Integer IVar13;
  long lVar14;
  int _d;
  long ndim;
  long lVar15;
  ushort uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  C_Integer CVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  char *pcVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long idx;
  int _index [7];
  Integer _hi [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer width [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar9 = pnga_has_ghosts(g_a);
  if (lVar9 != 0) {
    lVar30 = g_a + 1000;
    iVar1 = GA[lVar30].elemsize;
    ndim = (long)GA[lVar30].ndim;
    iVar2 = GA[lVar30].p_handle;
    lVar23 = 0;
    if (0 < ndim) {
      lVar23 = ndim;
    }
    for (lVar26 = 0; lVar23 * 8 - lVar26 != 0; lVar26 = lVar26 + 8) {
      *(undefined8 *)((long)increment + lVar26) = 0;
      *(undefined8 *)((long)width + lVar26) = *(undefined8 *)((long)GA[g_a + 1000].width + lVar26);
      *(undefined8 *)((long)dims + lVar26) = *(undefined8 *)((long)GA[g_a + 1000].dims + lVar26);
      if ((*(long *)((long)lo_loc + lVar26) == 0) && (*(long *)((long)hi_loc + lVar26) == -1)) {
        return 0;
      }
    }
    lVar9 = gai_check_ghost_distr(g_a);
    IVar12 = GAnproc;
    if (lVar9 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
      IVar12 = GAnproc;
    }
    proclist = (Integer *)malloc(IVar12 << 3);
    if (proclist == (Integer *)0x0) {
      pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    *GA_Update_Signal = 1;
    lVar10 = ndim + -1;
    lVar26 = lVar10;
    if (lVar10 < 1) {
      lVar26 = 0;
    }
    iVar33 = 0;
    for (idx = 0; ppiVar7 = GA_Update_Flags, IVar12 = GAme, idx != lVar23; idx = idx + 1) {
      lVar3 = width[idx];
      if (lVar3 != 0) {
        get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar9 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
        if (lVar9 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar30].name);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar12 = pnga_ndim(g_a);
            pcVar28 = err_string + (int)sVar11;
            if (IVar12 <= lVar34) break;
            sprintf(pcVar28,",%ld:%ld ",slo_rem[lVar34],shi_rem[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar28[0] = ']';
          pcVar28[1] = '\0';
          pnga_error(err_string,g_a);
        }
        IVar12 = *proclist;
        pnga_distribution(g_a,IVar12,tlo_rem,thi_rem);
        for (lVar34 = 0; lVar23 != lVar34; lVar34 = lVar34 + 1) {
          if (increment[lVar34] == 0) {
            if (idx == lVar34) {
              plo_rem[idx] = lVar3 + 1 + (thi_rem[idx] - tlo_rem[idx]);
              phi_rem[idx] = (thi_rem[idx] - tlo_rem[idx]) + lVar3 * 2;
              plo_loc[idx] = lVar3;
            }
            else {
              lVar18 = width[lVar34];
              plo_rem[lVar34] = lVar18;
              phi_rem[lVar34] = (thi_rem[lVar34] + lVar18) - tlo_rem[lVar34];
              plo_loc[lVar34] = lVar18;
            }
          }
          else {
            plo_rem[lVar34] = 0;
            phi_rem[lVar34] = (increment[lVar34] + thi_rem[lVar34]) - tlo_rem[lVar34];
            plo_loc[lVar34] = 0;
          }
        }
        uVar16 = GA[lVar30].ndim;
        lVar34 = (long)(short)uVar16;
        iVar25 = GA[lVar30].distr_type;
        if (iVar25 - 1U < 3) {
          lVar17 = (long)(int)proc % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar17;
          IVar13 = proc;
          lVar18 = 0;
          while (lVar18 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar17) / GA[g_a + 1000].num_blocks[lVar18];
            lVar17 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar18 + 1];
            _index[lVar18 + 1] = (int)lVar17;
            lVar18 = lVar18 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          for (lVar18 = 0; (ulong)uVar8 * 4 != lVar18; lVar18 = lVar18 + 4) {
            iVar27 = *(int *)((long)_index + lVar18);
            lVar17 = *(long *)((long)GA[g_a + 1000].block_dims + lVar18 * 2);
            *(long *)(err_string + lVar18 * 2) = lVar17 * iVar27 + 1;
            lVar17 = ((long)iVar27 + 1) * lVar17;
            lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar18 * 2);
            if (lVar29 <= lVar17) {
              lVar17 = lVar29;
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar17;
          }
        }
        else if (iVar25 == 4) {
          lVar17 = (long)(int)proc % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar17;
          IVar13 = proc;
          lVar18 = 0;
          while (lVar18 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar17) / GA[g_a + 1000].num_blocks[lVar18];
            lVar17 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar18 + 1];
            _index[lVar18 + 1] = (int)lVar17;
            lVar18 = lVar18 + 1;
          }
          lVar18 = 0;
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          iVar27 = 0;
          for (; (ulong)uVar8 * 4 != lVar18; lVar18 = lVar18 + 4) {
            pCVar6 = GA[lVar30].mapc;
            iVar31 = *(int *)((long)_index + lVar18);
            lVar29 = (long)iVar27 + (long)iVar31;
            *(C_Integer *)(err_string + lVar18 * 2) = pCVar6[lVar29];
            lVar17 = *(long *)((long)GA[lVar30].num_blocks + lVar18 * 2);
            if ((long)iVar31 < lVar17 + -1) {
              lVar29 = pCVar6[lVar29 + 1] + -1;
            }
            else {
              lVar29 = *(long *)((long)GA[lVar30].dims + lVar18 * 2);
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar29;
            iVar27 = iVar27 + (int)lVar17;
          }
        }
        else if (iVar25 == 0) {
          if (GA[lVar30].num_rstrctd == 0) {
            lVar18 = 0;
            if (0 < lVar34) {
              lVar18 = lVar34;
            }
            lVar17 = 1;
            for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
              lVar17 = lVar17 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar17 <= proc)) {
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                plo_loc[lVar17 + -0x20] = 0;
                _hi[lVar17] = -1;
              }
            }
            else {
              lVar17 = 0;
              IVar13 = proc;
              for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
                lVar15 = (long)GA[g_a + 1000].nblock[lVar29];
                lVar14 = IVar13 % lVar15;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar29 + -0x20] = pCVar6[lVar14 + lVar17];
                if (lVar14 == lVar15 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar29];
                }
                else {
                  CVar22 = pCVar6[lVar14 + lVar17 + 1] + -1;
                }
                lVar17 = lVar17 + lVar15;
                _hi[lVar29] = CVar22;
                IVar13 = IVar13 / lVar15;
              }
            }
          }
          else if (proc < GA[lVar30].num_rstrctd) {
            lVar18 = 0;
            if (0 < lVar34) {
              lVar18 = lVar34;
            }
            lVar17 = 1;
            for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
              lVar17 = lVar17 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((proc < 0) || (lVar17 <= proc)) {
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                plo_loc[lVar17 + -0x20] = 0;
                _hi[lVar17] = -1;
              }
            }
            else {
              lVar17 = 0;
              IVar13 = proc;
              for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
                lVar15 = (long)GA[g_a + 1000].nblock[lVar29];
                lVar14 = IVar13 % lVar15;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar29 + -0x20] = pCVar6[lVar14 + lVar17];
                if (lVar14 == lVar15 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar29];
                }
                else {
                  CVar22 = pCVar6[lVar14 + lVar17 + 1] + -1;
                }
                lVar17 = lVar17 + lVar15;
                _hi[lVar29] = CVar22;
                IVar13 = IVar13 / lVar15;
              }
            }
          }
          else {
            iVar27 = 0;
            if (0 < (short)uVar16) {
              iVar27 = (int)(short)uVar16;
            }
            for (lVar18 = 0; iVar27 != lVar18; lVar18 = lVar18 + 1) {
              plo_loc[lVar18 + -0x20] = 0;
              _hi[lVar18] = -1;
            }
          }
        }
        lVar18 = lVar34 + -1;
        if (lVar18 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar30].width[0] * 2 + 1;
        }
        lVar17 = 0;
        if (0 < lVar18) {
          lVar17 = lVar18;
        }
        lVar14 = 0;
        lVar29 = 1;
        for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 1) {
          lVar14 = lVar14 + plo_loc[lVar15] * lVar29;
          lVar19 = (_hi[lVar15] - plo_loc[lVar15 + -0x20]) + GA[g_a + 1000].width[lVar15] * 2 + 1;
          ld_loc[lVar15] = lVar19;
          lVar29 = lVar29 * lVar19;
        }
        lVar15 = plo_loc[lVar34 + -1];
        ppcVar4 = GA[lVar30].ptr;
        iVar27 = GA[lVar30].elemsize;
        pcVar28 = ppcVar4[proc];
        if (iVar25 - 1U < 3) {
          lVar20 = (long)(int)IVar12 % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar13 = IVar12;
          lVar19 = 0;
          while (lVar19 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar19];
            lVar20 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar20;
            lVar19 = lVar19 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          for (lVar19 = 0; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            iVar25 = *(int *)((long)_index + lVar19);
            lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
            *(long *)(err_string + lVar19 * 2) = lVar20 * iVar25 + 1;
            lVar20 = ((long)iVar25 + 1) * lVar20;
            lVar32 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
            if (lVar32 <= lVar20) {
              lVar20 = lVar32;
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar20;
          }
        }
        else if (iVar25 == 4) {
          lVar20 = (long)(int)IVar12 % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar13 = IVar12;
          lVar19 = 0;
          while (lVar19 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar19];
            lVar20 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar20;
            lVar19 = lVar19 + 1;
          }
          lVar19 = 0;
          if ((short)uVar16 < 1) {
            uVar16 = 0;
          }
          iVar25 = 0;
          for (; (ulong)uVar16 * 4 != lVar19; lVar19 = lVar19 + 4) {
            pCVar6 = GA[lVar30].mapc;
            iVar31 = *(int *)((long)_index + lVar19);
            lVar32 = (long)iVar25 + (long)iVar31;
            *(C_Integer *)(err_string + lVar19 * 2) = pCVar6[lVar32];
            lVar20 = *(long *)((long)GA[lVar30].num_blocks + lVar19 * 2);
            if ((long)iVar31 < lVar20 + -1) {
              lVar32 = pCVar6[lVar32 + 1] + -1;
            }
            else {
              lVar32 = *(long *)((long)GA[lVar30].dims + lVar19 * 2);
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar32;
            iVar25 = iVar25 + (int)lVar20;
          }
        }
        else if (iVar25 == 0) {
          if (GA[lVar30].num_rstrctd == 0) {
            lVar19 = lVar34;
            if (lVar34 < 1) {
              lVar19 = 0;
            }
            lVar20 = 1;
            for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar32];
            }
            if ((IVar12 < 0) || (lVar20 <= IVar12)) {
              for (lVar20 = 0; lVar19 != lVar20; lVar20 = lVar20 + 1) {
                plo_loc[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar13 = IVar12;
              for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
                lVar24 = (long)GA[g_a + 1000].nblock[lVar32];
                lVar21 = IVar13 % lVar24;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar32 + -0x20] = pCVar6[lVar21 + lVar20];
                if (lVar21 == lVar24 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar32];
                }
                else {
                  CVar22 = pCVar6[lVar21 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar24;
                _hi[lVar32] = CVar22;
                IVar13 = IVar13 / lVar24;
              }
            }
          }
          else if (IVar12 < GA[lVar30].num_rstrctd) {
            lVar19 = lVar34;
            if (lVar34 < 1) {
              lVar19 = 0;
            }
            lVar20 = 1;
            for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar32];
            }
            if ((IVar12 < 0) || (lVar20 <= IVar12)) {
              for (lVar20 = 0; lVar19 != lVar20; lVar20 = lVar20 + 1) {
                plo_loc[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar13 = IVar12;
              for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
                lVar24 = (long)GA[g_a + 1000].nblock[lVar32];
                lVar21 = IVar13 % lVar24;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar32 + -0x20] = pCVar6[lVar21 + lVar20];
                if (lVar21 == lVar24 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar32];
                }
                else {
                  CVar22 = pCVar6[lVar21 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar24;
                _hi[lVar32] = CVar22;
                IVar13 = IVar13 / lVar24;
              }
            }
          }
          else {
            iVar25 = 0;
            if (0 < (short)uVar16) {
              iVar25 = (int)(short)uVar16;
            }
            for (lVar19 = 0; iVar25 != lVar19; lVar19 = lVar19 + 1) {
              plo_loc[lVar19 + -0x20] = 0;
              _hi[lVar19] = -1;
            }
          }
        }
        if (lVar18 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar30].width[0] * 2 + 1;
        }
        lVar19 = 0;
        lVar18 = 1;
        for (lVar20 = 0; lVar17 != lVar20; lVar20 = lVar20 + 1) {
          lVar19 = lVar19 + plo_rem[lVar20] * lVar18;
          lVar32 = (_hi[lVar20] - plo_loc[lVar20 + -0x20]) + GA[g_a + 1000].width[lVar20] * 2 + 1;
          ld_rem[lVar20] = lVar32;
          lVar18 = lVar18 * lVar32;
        }
        lVar34 = plo_rem[lVar34 + -1];
        pcVar5 = ppcVar4[IVar12];
        stride_loc[0] = iVar1;
        stride_rem[0] = iVar1;
        iVar25 = iVar1;
        iVar31 = iVar1;
        for (lVar17 = 0; lVar26 * 4 != lVar17; lVar17 = lVar17 + 4) {
          iVar31 = iVar31 * *(int *)((long)ld_rem + lVar17 * 2);
          *(int *)((long)stride_rem + lVar17) = iVar31;
          iVar25 = iVar25 * *(int *)((long)ld_loc + lVar17 * 2);
          *(int *)((long)stride_loc + lVar17) = iVar25;
          *(int *)((long)stride_rem + lVar17 + 4) = iVar31;
          *(int *)((long)stride_loc + lVar17 + 4) = iVar25;
        }
        for (lVar17 = 0; lVar23 != lVar17; lVar17 = lVar17 + 1) {
          count[lVar17] = ((int)phi_rem[lVar17] - (int)plo_rem[lVar17]) + 1;
        }
        count[0] = count[0] * iVar1;
        if (-1 < iVar2) {
          IVar12 = (Integer)PGRP_LIST[iVar2].inv_map_proc_list[IVar12];
        }
        ARMCI_PutS_flag(pcVar28 + (lVar29 * lVar15 + lVar14) * (long)iVar27,stride_loc,
                        pcVar5 + (lVar18 * lVar34 + lVar19) * (long)iVar27,stride_rem,count,
                        (int)lVar10,GA_Update_Flags[IVar12] + iVar33,*GA_Update_Signal,(int)IVar12);
        get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar9 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
        if (lVar9 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar30].name);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar12 = pnga_ndim(g_a);
            pcVar28 = err_string + (int)sVar11;
            if (IVar12 <= lVar34) break;
            sprintf(pcVar28,",%ld:%ld ",slo_rem[lVar34],shi_rem[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar28[0] = ']';
          pcVar28[1] = '\0';
          pnga_error(err_string,g_a);
        }
        IVar12 = *proclist;
        pnga_distribution(g_a,IVar12,tlo_rem,thi_rem);
        for (lVar34 = 0; lVar23 != lVar34; lVar34 = lVar34 + 1) {
          if (increment[lVar34] == 0) {
            if (idx == lVar34) {
              plo_rem[idx] = 0;
              phi_rem[idx] = lVar3 + -1;
              plo_loc[idx] = (hi_loc[idx] + lVar3 + -1) - lo_loc[idx];
            }
            else {
              lVar18 = width[lVar34];
              plo_rem[lVar34] = lVar18;
              phi_rem[lVar34] = (thi_rem[lVar34] + lVar18) - tlo_rem[lVar34];
              plo_loc[lVar34] = lVar18;
            }
          }
          else {
            plo_rem[lVar34] = 0;
            phi_rem[lVar34] = (increment[lVar34] + thi_rem[lVar34]) - tlo_rem[lVar34];
            plo_loc[lVar34] = 0;
          }
        }
        uVar16 = GA[lVar30].ndim;
        lVar34 = (long)(short)uVar16;
        iVar25 = GA[lVar30].distr_type;
        if (iVar25 - 1U < 3) {
          lVar17 = (long)(int)GAme % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar17;
          IVar13 = GAme;
          lVar18 = 0;
          while (lVar18 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar17) / GA[g_a + 1000].num_blocks[lVar18];
            lVar17 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar18 + 1];
            _index[lVar18 + 1] = (int)lVar17;
            lVar18 = lVar18 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          for (lVar18 = 0; (ulong)uVar8 * 4 != lVar18; lVar18 = lVar18 + 4) {
            iVar27 = *(int *)((long)_index + lVar18);
            lVar17 = *(long *)((long)GA[g_a + 1000].block_dims + lVar18 * 2);
            *(long *)(err_string + lVar18 * 2) = lVar17 * iVar27 + 1;
            lVar17 = ((long)iVar27 + 1) * lVar17;
            lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar18 * 2);
            if (lVar29 <= lVar17) {
              lVar17 = lVar29;
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar17;
          }
        }
        else if (iVar25 == 4) {
          lVar17 = (long)(int)GAme % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar17;
          IVar13 = GAme;
          lVar18 = 0;
          while (lVar18 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar17) / GA[g_a + 1000].num_blocks[lVar18];
            lVar17 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar18 + 1];
            _index[lVar18 + 1] = (int)lVar17;
            lVar18 = lVar18 + 1;
          }
          lVar18 = 0;
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          iVar27 = 0;
          for (; (ulong)uVar8 * 4 != lVar18; lVar18 = lVar18 + 4) {
            pCVar6 = GA[lVar30].mapc;
            iVar31 = *(int *)((long)_index + lVar18);
            lVar29 = (long)iVar27 + (long)iVar31;
            *(C_Integer *)(err_string + lVar18 * 2) = pCVar6[lVar29];
            lVar17 = *(long *)((long)GA[lVar30].num_blocks + lVar18 * 2);
            if ((long)iVar31 < lVar17 + -1) {
              lVar29 = pCVar6[lVar29 + 1] + -1;
            }
            else {
              lVar29 = *(long *)((long)GA[lVar30].dims + lVar18 * 2);
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar29;
            iVar27 = iVar27 + (int)lVar17;
          }
        }
        else if (iVar25 == 0) {
          if (GA[lVar30].num_rstrctd == 0) {
            lVar18 = 0;
            if (0 < lVar34) {
              lVar18 = lVar34;
            }
            lVar17 = 1;
            for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
              lVar17 = lVar17 * GA[g_a + 1000].nblock[lVar29];
            }
            if (GAme < lVar17 && -1 < GAme) {
              lVar29 = 0;
              IVar13 = GAme;
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                lVar15 = (long)GA[g_a + 1000].nblock[lVar17];
                lVar14 = IVar13 % lVar15;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar17 + -0x20] = pCVar6[lVar14 + lVar29];
                if (lVar14 == lVar15 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar17];
                }
                else {
                  CVar22 = pCVar6[lVar14 + lVar29 + 1] + -1;
                }
                lVar29 = lVar29 + lVar15;
                _hi[lVar17] = CVar22;
                IVar13 = IVar13 / lVar15;
              }
            }
            else {
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                plo_loc[lVar17 + -0x20] = 0;
                _hi[lVar17] = -1;
              }
            }
          }
          else if (GAme < GA[lVar30].num_rstrctd) {
            lVar18 = 0;
            if (0 < lVar34) {
              lVar18 = lVar34;
            }
            lVar17 = 1;
            for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 1) {
              lVar17 = lVar17 * GA[g_a + 1000].nblock[lVar29];
            }
            if ((GAme < 0) || (lVar17 <= GAme)) {
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                plo_loc[lVar17 + -0x20] = 0;
                _hi[lVar17] = -1;
              }
            }
            else {
              lVar29 = 0;
              IVar13 = GAme;
              for (lVar17 = 0; lVar18 != lVar17; lVar17 = lVar17 + 1) {
                lVar15 = (long)GA[g_a + 1000].nblock[lVar17];
                lVar14 = IVar13 % lVar15;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar17 + -0x20] = pCVar6[lVar14 + lVar29];
                if (lVar14 == lVar15 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar17];
                }
                else {
                  CVar22 = pCVar6[lVar14 + lVar29 + 1] + -1;
                }
                lVar29 = lVar29 + lVar15;
                _hi[lVar17] = CVar22;
                IVar13 = IVar13 / lVar15;
              }
            }
          }
          else {
            iVar27 = 0;
            if (0 < (short)uVar16) {
              iVar27 = (int)(short)uVar16;
            }
            for (lVar18 = 0; iVar27 != lVar18; lVar18 = lVar18 + 1) {
              plo_loc[lVar18 + -0x20] = 0;
              _hi[lVar18] = -1;
            }
          }
        }
        lVar18 = lVar34 + -1;
        if (lVar18 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar30].width[0] * 2 + 1;
        }
        lVar17 = 0;
        if (0 < lVar18) {
          lVar17 = lVar18;
        }
        lVar29 = 1;
        lVar14 = 0;
        for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 1) {
          lVar14 = lVar14 + plo_loc[lVar15] * lVar29;
          lVar19 = (_hi[lVar15] - plo_loc[lVar15 + -0x20]) + GA[g_a + 1000].width[lVar15] * 2 + 1;
          ld_loc[lVar15] = lVar19;
          lVar29 = lVar29 * lVar19;
        }
        lVar15 = plo_loc[lVar34 + -1];
        ppcVar4 = GA[lVar30].ptr;
        iVar27 = GA[lVar30].elemsize;
        pcVar28 = ppcVar4[GAme];
        if (iVar25 - 1U < 3) {
          lVar20 = (long)(int)IVar12 % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar13 = IVar12;
          lVar19 = 0;
          while (lVar19 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar19];
            lVar20 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar20;
            lVar19 = lVar19 + 1;
          }
          uVar8 = 0;
          if (0 < (short)uVar16) {
            uVar8 = uVar16;
          }
          for (lVar19 = 0; (ulong)uVar8 * 4 != lVar19; lVar19 = lVar19 + 4) {
            iVar25 = *(int *)((long)_index + lVar19);
            lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
            *(long *)(err_string + lVar19 * 2) = lVar20 * iVar25 + 1;
            lVar20 = ((long)iVar25 + 1) * lVar20;
            lVar32 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
            if (lVar32 <= lVar20) {
              lVar20 = lVar32;
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar20;
          }
        }
        else if (iVar25 == 4) {
          lVar20 = (long)(int)IVar12 % GA[lVar30].num_blocks[0];
          _index[0] = (int)lVar20;
          IVar13 = IVar12;
          lVar19 = 0;
          while (lVar19 + 1 < lVar34) {
            IVar13 = (long)((int)IVar13 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar19];
            lVar20 = (long)(int)IVar13 % GA[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar20;
            lVar19 = lVar19 + 1;
          }
          lVar19 = 0;
          if ((short)uVar16 < 1) {
            uVar16 = 0;
          }
          iVar25 = 0;
          for (; (ulong)uVar16 * 4 != lVar19; lVar19 = lVar19 + 4) {
            pCVar6 = GA[lVar30].mapc;
            iVar31 = *(int *)((long)_index + lVar19);
            lVar32 = (long)iVar25 + (long)iVar31;
            *(C_Integer *)(err_string + lVar19 * 2) = pCVar6[lVar32];
            lVar20 = *(long *)((long)GA[lVar30].num_blocks + lVar19 * 2);
            if ((long)iVar31 < lVar20 + -1) {
              lVar32 = pCVar6[lVar32 + 1] + -1;
            }
            else {
              lVar32 = *(long *)((long)GA[lVar30].dims + lVar19 * 2);
            }
            *(long *)((long)_hi + lVar19 * 2) = lVar32;
            iVar25 = iVar25 + (int)lVar20;
          }
        }
        else if (iVar25 == 0) {
          if (GA[lVar30].num_rstrctd == 0) {
            lVar19 = lVar34;
            if (lVar34 < 1) {
              lVar19 = 0;
            }
            lVar20 = 1;
            for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar32];
            }
            if ((IVar12 < 0) || (lVar20 <= IVar12)) {
              for (lVar20 = 0; lVar19 != lVar20; lVar20 = lVar20 + 1) {
                plo_loc[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar13 = IVar12;
              for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
                lVar24 = (long)GA[g_a + 1000].nblock[lVar32];
                lVar21 = IVar13 % lVar24;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar32 + -0x20] = pCVar6[lVar21 + lVar20];
                if (lVar21 == lVar24 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar32];
                }
                else {
                  CVar22 = pCVar6[lVar21 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar24;
                _hi[lVar32] = CVar22;
                IVar13 = IVar13 / lVar24;
              }
            }
          }
          else if (IVar12 < GA[lVar30].num_rstrctd) {
            lVar19 = lVar34;
            if (lVar34 < 1) {
              lVar19 = 0;
            }
            lVar20 = 1;
            for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar32];
            }
            if ((IVar12 < 0) || (lVar20 <= IVar12)) {
              for (lVar20 = 0; lVar19 != lVar20; lVar20 = lVar20 + 1) {
                plo_loc[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
            else {
              lVar20 = 0;
              IVar13 = IVar12;
              for (lVar32 = 0; lVar19 != lVar32; lVar32 = lVar32 + 1) {
                lVar24 = (long)GA[g_a + 1000].nblock[lVar32];
                lVar21 = IVar13 % lVar24;
                pCVar6 = GA[lVar30].mapc;
                plo_loc[lVar32 + -0x20] = pCVar6[lVar21 + lVar20];
                if (lVar21 == lVar24 + -1) {
                  CVar22 = GA[g_a + 1000].dims[lVar32];
                }
                else {
                  CVar22 = pCVar6[lVar21 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar24;
                _hi[lVar32] = CVar22;
                IVar13 = IVar13 / lVar24;
              }
            }
          }
          else {
            iVar25 = 0;
            if (0 < (short)uVar16) {
              iVar25 = (int)(short)uVar16;
            }
            for (lVar19 = 0; iVar25 != lVar19; lVar19 = lVar19 + 1) {
              plo_loc[lVar19 + -0x20] = 0;
              _hi[lVar19] = -1;
            }
          }
        }
        if (lVar18 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar30].width[0] * 2 + 1;
        }
        lVar18 = 1;
        lVar19 = 0;
        for (lVar20 = 0; lVar17 != lVar20; lVar20 = lVar20 + 1) {
          lVar19 = lVar19 + plo_rem[lVar20] * lVar18;
          lVar32 = (_hi[lVar20] - plo_loc[lVar20 + -0x20]) + GA[g_a + 1000].width[lVar20] * 2 + 1;
          ld_rem[lVar20] = lVar32;
          lVar18 = lVar18 * lVar32;
        }
        lVar34 = plo_rem[lVar34 + -1];
        pcVar5 = ppcVar4[IVar12];
        stride_loc[0] = iVar1;
        stride_rem[0] = iVar1;
        iVar25 = iVar1;
        iVar31 = iVar1;
        for (lVar17 = 0; lVar26 != lVar17; lVar17 = lVar17 + 1) {
          iVar31 = iVar31 * (int)ld_rem[lVar17];
          stride_rem[lVar17] = iVar31;
          iVar25 = iVar25 * (int)ld_loc[lVar17];
          stride_loc[lVar17] = iVar25;
          stride_rem[lVar17 + 1] = iVar31;
          stride_loc[lVar17 + 1] = iVar25;
        }
        for (lVar17 = 0; lVar23 != lVar17; lVar17 = lVar17 + 1) {
          count[lVar17] = ((int)phi_rem[lVar17] - (int)plo_rem[lVar17]) + 1;
        }
        count[0] = count[0] * iVar1;
        if (-1 < iVar2) {
          IVar12 = (Integer)PGRP_LIST[iVar2].inv_map_proc_list[IVar12];
        }
        ARMCI_PutS_flag(pcVar28 + (lVar29 * lVar15 + lVar14) * (long)iVar27,stride_loc,
                        pcVar5 + (lVar18 * lVar34 + lVar19) * (long)iVar27,stride_rem,count,
                        (int)lVar10,GA_Update_Flags[IVar12] + (long)iVar33 + 1,*GA_Update_Signal,
                        (int)IVar12);
        iVar33 = iVar33 + 2;
      }
      waitforflags(GA_Update_Flags[GAme] + (long)iVar33 + -2,
                   GA_Update_Flags[GAme] + (long)iVar33 + -1);
      increment[idx] = lVar3 * 2;
    }
    lVar23 = 0;
    lVar30 = ndim * 2;
    if (ndim * 2 < 1) {
      lVar30 = lVar23;
    }
    for (; lVar30 != lVar23; lVar23 = lVar23 + 1) {
      ppiVar7[IVar12][lVar23] = 0;
    }
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update55_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  int msgcnt;
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update55_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update55_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);
#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;

      /* Perform update in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(GAme, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
#if 0
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count, ndim- 1, proc_rem);
      /* Send signal to remote processor that data transfer has been completed. */
      bytes = sizeof(int);
      ARMCI_Put(GA_Update_Signal, GA_Update_Flags[proc_rem]+msgcnt, bytes, proc_rem);

#else
      ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
          *GA_Update_Signal, (int)proc_rem);
#endif
      msgcnt++;
    }
    /* check to make sure that all messages have been recieved before
       starting update along new dimension */
    waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
        (GA_Update_Flags[GAme]+msgcnt-1));
    /* update increment array */
    increment[idx] = 2*nwidth;
  }

  /* set GA_Update_Flags array to zero for next update operation. */
  for (idx=0; idx < 2*ndim; idx++) {
    GA_Update_Flags[GAme][idx] = 0;
  }

  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}